

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O1

optional<unsigned_char> __thiscall
nesvis::MemoryWidget::read_mem
          (MemoryWidget *this,function<unsigned_char_(unsigned_short)> *memory_read_func,
          uint16_t address)

{
  byte bVar1;
  unsigned_short local_2;
  
  if ((memory_read_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    bVar1 = (*memory_read_func->_M_invoker)((_Any_data *)memory_read_func,&local_2);
    return (_Optional_base<unsigned_char,_true,_true>)(bVar1 | 0x100);
  }
  std::__throw_bad_function_call();
}

Assistant:

std::optional<uint8_t> read_mem(
            const std::function<uint8_t(uint16_t)> &memory_read_func,
            const uint16_t address) {
        try {
            return memory_read_func(address);
        } catch (n_e_s::core::InvalidAddress &) {
            return std::nullopt;
        }
    }